

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTCallFunctionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  CallInfo CVar2;
  bool bVar3;
  BOOL BVar4;
  ScriptContext *this;
  JsRTCallFunctionAction *pJVar5;
  ThreadContext *pTVar6;
  RecyclableObject *this_00;
  ScriptContext *pSVar7;
  undefined4 *puVar8;
  TTDebuggerSourceLocation lastLocation_1;
  JavascriptException *err;
  TTDebuggerSourceLocation lastLocation;
  ScriptAbortException anon_var_0;
  TTDebuggerSourceLocation lastLocation_2;
  Arguments local_b0;
  Var local_a0;
  Var result_1;
  Var local_88;
  Var result;
  undefined1 local_78 [8];
  Arguments jsArgs;
  RecyclableObject *__obj_1;
  Var argi;
  CallInfo CStack_50;
  uint32 i;
  CallInfo callInfo;
  JavascriptFunction *jsFunction;
  RecyclableObject *__obj;
  Var jsFunctionVar;
  ThreadContext *threadContext;
  JsRTCallFunctionAction *cfAction;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  this = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (this == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar5 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  pTVar6 = Js::ScriptContext::GetThreadContext(this);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,*pJVar5->ArgArray);
  if ((__obj != (RecyclableObject *)0x0) &&
     (bVar3 = Js::VarIs<Js::JavascriptFunction>(__obj), bVar3)) {
    this_00 = Js::VarTo<Js::RecyclableObject>(__obj);
    pSVar7 = Js::RecyclableObject::GetScriptContext(this_00);
    if (pSVar7 != this) {
      __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(this,this_00,false);
    }
    callInfo = (CallInfo)Js::VarTo<Js::JavascriptFunction>(__obj);
    Js::CallInfo::CallInfo(&stack0xffffffffffffffb0,(short)pJVar5->ArgCount - 1);
    for (argi._4_4_ = 1; argi._4_4_ < pJVar5->ArgCount; argi._4_4_ = argi._4_4_ + 1) {
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pJVar5->ArgArray[argi._4_4_]);
      if (__obj_1 == (RecyclableObject *)0x0) {
        return;
      }
      bVar3 = Js::VarIs<Js::RecyclableObject>(__obj_1);
      if (bVar3) {
        jsArgs.Values = (Type)Js::VarTo<Js::RecyclableObject>(__obj_1);
        pSVar7 = Js::RecyclableObject::GetScriptContext((RecyclableObject *)jsArgs.Values);
        if (pSVar7 != this) {
          __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(this,jsArgs.Values,false);
        }
      }
      pJVar5->AdditionalReplayInfo->ExecArgs[argi._4_4_ - 1] = __obj_1;
    }
    result = (Var)CStack_50;
    Js::Arguments::Arguments((Arguments *)local_78,CStack_50,pJVar5->AdditionalReplayInfo->ExecArgs)
    ;
    CVar2 = callInfo;
    if (pJVar5->CallbackDepth == 0) {
      EventLog::ResetCallStackForTopLevelCall(pTVar6->TTDLog,pJVar5->TopLevelCallbackEventTime);
      if (pTVar6->TTDExecutionInfo != (ExecutionInfoManager *)0x0) {
        ExecutionInfoManager::ResetCallStackForTopLevelCall
                  (pTVar6->TTDExecutionInfo,pJVar5->TopLevelCallbackEventTime);
      }
      CVar2 = callInfo;
      Js::Arguments::Arguments(&local_b0,(Arguments *)local_78);
      local_a0 = Js::JavascriptFunction::CallRootFunction
                           ((JavascriptFunction *)CVar2,&local_b0,this,true);
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                (executeContext,evt,local_a0);
      bVar3 = EventCompletesNormally(evt);
      if (!bVar3) {
        TTDAbort_unrecoverable_error("Why did we get a different completion");
      }
    }
    else {
      Js::Arguments::Arguments((Arguments *)&result_1,(Arguments *)local_78);
      local_88 = Js::JavascriptFunction::CallRootFunction
                           ((JavascriptFunction *)CVar2,(Arguments *)&result_1,this,true);
      if (((local_88 != (Var)0x0) && (local_88 != (Var)0x0)) &&
         (BVar4 = Js::CrossSite::NeedMarshalVar(local_88,this), BVar4 != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                           ,0x475,
                           "(result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx))",
                           "result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                (executeContext,evt,local_88);
      bVar3 = EventCompletesNormally(evt);
      if (!bVar3) {
        TTDAbort_unrecoverable_error("Why did we get a different completion");
      }
    }
  }
  return;
}

Assistant:

void JsRTCallFunctionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);

            const JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            ThreadContext* threadContext = ctx->GetThreadContext();

            Js::Var jsFunctionVar = InflateVarInReplay(executeContext, cfAction->ArgArray[0]);
            TTD_REPLAY_VALIDATE_INCOMING_FUNCTION(jsFunctionVar, ctx);

            Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(jsFunctionVar);

            //remove implicit constructor function as first arg in callInfo and argument loop below
            Js::CallInfo callInfo((ushort)(cfAction->ArgCount - 1));
            for(uint32 i = 1; i < cfAction->ArgCount; ++i)
            {
                 Js::Var argi = InflateVarInReplay(executeContext, cfAction->ArgArray[i]);
                 TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(argi, ctx);

                 cfAction->AdditionalReplayInfo->ExecArgs[i - 1] = argi;
            }
            Js::Arguments jsArgs(callInfo, cfAction->AdditionalReplayInfo->ExecArgs);

            //If this isn't a root function then just call it -- don't need to reset anything and exceptions can just continue
            if(cfAction->CallbackDepth != 0)
            {
                Js::Var result = jsFunction->CallRootFunction(jsArgs, ctx, true);
                if(result != nullptr)
                {
                    Assert(result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx));
                }

                //since we tag in JsRT we need to tag here too
                JsRTActionHandleResultForReplay<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(executeContext, evt, result);

                TTDAssert(NSLogEvents::EventCompletesNormally(evt), "Why did we get a different completion");
            }
            else
            {
                threadContext->TTDLog->ResetCallStackForTopLevelCall(cfAction->TopLevelCallbackEventTime);
                if(threadContext->TTDExecutionInfo != nullptr)
                {
                    threadContext->TTDExecutionInfo->ResetCallStackForTopLevelCall(cfAction->TopLevelCallbackEventTime);
                }

                try
                {
                    Js::Var result = jsFunction->CallRootFunction(jsArgs, ctx, true);

                    //since we tag in JsRT we need to tag here too
                    JsRTActionHandleResultForReplay<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(executeContext, evt, result);

                    TTDAssert(NSLogEvents::EventCompletesNormally(evt), "Why did we get a different completion");
                }
                catch(const Js::JavascriptException& err)
                {
                    TTDAssert(NSLogEvents::EventCompletesWithException(evt), "Why did we get a different exception");

                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        //convert to uncaught debugger exception for host
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);

                        err.GetAndClear();  // discard exception object

                        //Reset any step controller logic
                        if(ctx->GetThreadContext()->GetDebugManager() != nullptr)
                        {
                            ctx->GetThreadContext()->GetDebugManager()->stepController.Deactivate();
                        }

                        throw TTDebuggerAbortException::CreateUncaughtExceptionAbortRequest(lastLocation.GetRootEventTime(), _u("Uncaught JavaScript exception -- Propagate to top-level."));
                    }

                    throw;
                }
                catch(Js::ScriptAbortException)
                {
                    TTDAssert(NSLogEvents::EventCompletesWithException(evt), "Why did we get a different exception");

                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        //convert to uncaught debugger exception for host
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);

                        throw TTDebuggerAbortException::CreateUncaughtExceptionAbortRequest(lastLocation.GetRootEventTime(), _u("Uncaught Script exception -- Propagate to top-level."));
                    }
                    else
                    {
                        throw;
                    }
                }
                catch(...)
                {
                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);
                    }

                    throw;
                }
            }
        }